

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

void __thiscall
CRegexParser::build_concat
          (CRegexParser *this,re_machine *new_machine,re_machine *lhs,re_machine *rhs)

{
  init_machine(this,new_machine);
  set_trans(this,new_machine->init,lhs->init,RE_EPSILON,L'\0');
  set_trans(this,lhs->final,rhs->init,RE_EPSILON,L'\0');
  set_trans(this,rhs->final,new_machine->final,RE_EPSILON,L'\0');
  return;
}

Assistant:

void CRegexParser::build_concat(re_machine *new_machine,
                                re_machine *lhs, re_machine *rhs)
{
    /* initialize the new machine */
    init_machine(new_machine);

    /* 
     *   set up an epsilon transition from the new machine's initial state
     *   to the first submachine's initial state 
     */
    set_trans(new_machine->init, lhs->init, RE_EPSILON, 0);

    /*
     *   Set up an epsilon transition from the first submachine's final
     *   state to the second submachine's initial state 
     */
    set_trans(lhs->final, rhs->init, RE_EPSILON, 0);

    /*
     *   Set up an epsilon transition from the second submachine's final
     *   state to our new machine's final state 
     */
    set_trans(rhs->final, new_machine->final, RE_EPSILON, 0);
}